

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyword_helper.cpp
# Opt level: O2

bool duckdb::KeywordHelper::RequiresQuotes(string *text,bool allow_caps)

{
  byte *pbVar1;
  bool bVar2;
  size_type sVar3;
  byte bVar4;
  
  pbVar1 = (byte *)(text->_M_dataplus)._M_p;
  sVar3 = 0;
  do {
    if (text->_M_string_length == sVar3) {
      bVar2 = IsKeyword(text);
      return bVar2;
    }
    if (sVar3 == 0) {
      bVar4 = *pbVar1;
LAB_01224178:
      if (0x19 < (byte)(bVar4 + 0x9f)) {
        if (allow_caps) {
          if (((char)bVar4 < 'A') || (bVar4 != 0x5f && 0x5a < bVar4)) {
            return true;
          }
        }
        else if (bVar4 != 0x5f) {
          return true;
        }
      }
    }
    else {
      bVar4 = pbVar1[sVar3];
      if (9 < (byte)(bVar4 - 0x30)) goto LAB_01224178;
    }
    sVar3 = sVar3 + 1;
  } while( true );
}

Assistant:

bool KeywordHelper::RequiresQuotes(const string &text, bool allow_caps) {
	for (size_t i = 0; i < text.size(); i++) {
		if (i > 0 && (text[i] >= '0' && text[i] <= '9')) {
			continue;
		}
		if (text[i] >= 'a' && text[i] <= 'z') {
			continue;
		}
		if (allow_caps) {
			if (text[i] >= 'A' && text[i] <= 'Z') {
				continue;
			}
		}
		if (text[i] == '_') {
			continue;
		}
		return true;
	}
	return IsKeyword(text);
}